

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::AtomicMachine::Atomic<unsigned_int>
          (AtomicMachine *this,int target,int stage,GLenum internalformat)

{
  GLenum target_00;
  AtomicMachine *pAVar1;
  bool bVar2;
  TestLog **this_00;
  undefined8 uVar3;
  ivec4 *extraout_RDX;
  ivec4 *extraout_RDX_00;
  Vector<int,_4> *v;
  ivec4 *extraout_RDX_01;
  ivec4 *b;
  ulong uVar4;
  bool bVar5;
  GLenum *pGVar6;
  undefined4 in_register_00000034;
  GLenum in_R8D;
  CallLogWrapper *this_01;
  int i;
  long lVar7;
  GLuint local_a0;
  GLuint textures [4];
  string local_88;
  AtomicMachine *local_60;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> b_data;
  ShaderImageLoadStoreBase aSStack_40 [16];
  
  if (stage == 0) {
    GenShader<unsigned_int>
              (&local_88,(AtomicMachine *)CONCAT44(in_register_00000034,target),0,internalformat,
               in_R8D);
    local_a0 = ShaderImageLoadStoreBase::BuildProgram
                         (&this->super_ShaderImageLoadStoreBase,local_88._M_dataplus._M_p,
                          "\nvoid main() {\n  discard;\n}",true,false);
  }
  else {
    local_a0 = 0;
    if (stage != 4) goto LAB_00c5fd17;
    GenShader<unsigned_int>
              (&local_88,(AtomicMachine *)CONCAT44(in_register_00000034,target),4,internalformat,
               in_R8D);
    local_a0 = ShaderImageLoadStoreBase::CreateComputeProgram
                         (&this->super_ShaderImageLoadStoreBase,&local_88,true);
  }
  std::__cxx11::string::~string((string *)&local_88);
LAB_00c5fd17:
  this_01 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  local_60 = this;
  glu::CallLogWrapper::glGenTextures(this_01,4,textures);
  pGVar6 = &DAT_01752dc0;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    target_00 = *pGVar6;
    glu::CallLogWrapper::glBindTexture(this_01,target_00,textures[lVar7]);
    glu::CallLogWrapper::glTexParameteri(this_01,target_00,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_01,target_00,0x2800,0x2600);
    glu::CallLogWrapper::glTexStorage2D(this_01,0xde1,1,0x8236,100,1);
    pGVar6 = pGVar6 + 1;
  }
  glu::CallLogWrapper::glBindImageTexture(this_01,1,textures[0],0,'\0',0,0x88ba,0x8236);
  glu::CallLogWrapper::glBindImageTexture(this_01,2,textures[1],0,'\x01',0,0x88ba,0x8236);
  glu::CallLogWrapper::glBindImageTexture(this_01,0,textures[2],0,'\x01',0,0x88ba,0x8236);
  glu::CallLogWrapper::glBindImageTexture(this_01,3,textures[3],0,'\x01',0,0x88ba,0x8236);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&b_data,100,(allocator_type *)&local_88);
  pAVar1 = local_60;
  glu::CallLogWrapper::glBindBufferBase(this_01,0x90d2,0,local_60->m_buffer);
  glu::CallLogWrapper::glBufferData
            (this_01,0x90d2,0x640,
             b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glUseProgram(this_01,local_a0);
  glu::CallLogWrapper::glBindVertexArray(this_01,pAVar1->m_vao);
  if (stage == 0) {
    glu::CallLogWrapper::glDrawArrays(this_01,0,0,100);
  }
  else if (stage == 4) {
    glu::CallLogWrapper::glDispatchCompute(this_01,1,1,1);
  }
  glu::CallLogWrapper::glMemoryBarrier(this_01,0x200);
  uVar3 = 0x640;
  this_00 = (TestLog **)glu::CallLogWrapper::glMapBufferRange(this_01,0x90d2,0,0x640,1);
  bVar5 = true;
  b = extraout_RDX;
  for (uVar4 = 0; uVar4 != 100; uVar4 = uVar4 + 1) {
    local_88._M_dataplus._M_p = (char *)0x100000000;
    local_88._M_string_length = 0x100000000;
    bVar2 = ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)this_00,(ivec4 *)&local_88,b,(GLenum)uVar3);
    b = extraout_RDX_00;
    if (!bVar2) {
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)aSStack_40,(Vector<int,_4> *)this_00);
      glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_88,aSStack_40,v);
      anon_unknown_0::Output
                ("[%d] Atomic operation check failed. (%s) \n",uVar4 & 0xffffffff,
                 local_88._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_88);
      bVar5 = false;
      b = extraout_RDX_01;
    }
    this_00 = this_00 + 2;
  }
  glu::CallLogWrapper::glUnmapBuffer(this_01,0x90d2);
  glu::CallLogWrapper::glUseProgram(this_01,0);
  glu::CallLogWrapper::glDeleteProgram(this_01,local_a0);
  glu::CallLogWrapper::glDeleteTextures(this_01,4,textures);
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>)
  ;
  return bVar5;
}

Assistant:

bool Atomic(int target, int stage, GLenum internalformat)
	{
		GLuint program = 0;
		if (stage == 0)
		{ // VS
			const char* src_fs = NL "void main() {" NL "  discard;" NL "}";
			program			   = BuildProgram(GenShader<T>(target, stage, internalformat).c_str(), src_fs, true, false);
		}
		else if (stage == 4)
		{ // CS
			program = CreateComputeProgram(GenShader<T>(target, stage, internalformat), true);
		}

		const GLenum targets[] = { GL_TEXTURE_2D, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		const int	kTargets  = sizeof(targets) / sizeof(targets[0]);
		const int	kSize	 = 100;

		GLuint textures[kTargets];
		glGenTextures(kTargets, textures);

		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glTexParameteri(targets[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(targets[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			if (targets[i] == GL_TEXTURE_2D)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, 1);
			}
			else if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, kSize, 1, 2);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, kSize);
			}
		}
		glBindImageTexture(1, textures[0], 0, GL_FALSE, 0, GL_READ_WRITE, internalformat); // 2D
		glBindImageTexture(2, textures[1], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);  // 3D
		glBindImageTexture(0, textures[2], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);  // Cube
		glBindImageTexture(3, textures[3], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);  // 2DArray

		std::vector<ivec4> b_data(kSize);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * 4 * 4, &b_data[0], GL_STATIC_DRAW);

		glUseProgram(program);
		glBindVertexArray(m_vao);
		if (stage == 0)
		{ // VS
			glDrawArrays(GL_POINTS, 0, kSize);
		}
		else if (stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool   status   = true;
		ivec4* out_data = (ivec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize; ++i)
		{
			if (!Equal(out_data[i], ivec4(0, 1, 0, 1), 0))
			{
				status = false;
				Output("[%d] Atomic operation check failed. (%s) \n", i, ToString(out_data[i]).c_str());
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(kTargets, textures);
		return status;
	}